

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall
DensityCalculator<long_double,double>::initialize_bdens<InputData<double,long>>
          (DensityCalculator<long_double,_double> *this,InputData<double,_long> *input_data,
          ModelParams *model_params,vector<unsigned_long,_std::allocator<unsigned_long>_> *ix_arr,
          ColumnSampler<long_double> *col_sampler)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  unsigned_long *col_num;
  size_type sVar4;
  size_t end;
  reference pvVar5;
  char *col_00;
  reference pvVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  long in_RDX;
  long in_RSI;
  bool *in_RDI;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 Var7;
  double __x;
  double in_XMM1_Qa;
  size_t col;
  vector<signed_char,_std::allocator<signed_char>_> categ_present;
  size_t npresent;
  bool unsplittable;
  size_t col_1;
  value_type_conflict3 *in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe72;
  undefined4 in_stack_fffffffffffffe74;
  ColumnSampler<long_double> *in_stack_fffffffffffffe78;
  undefined2 in_stack_fffffffffffffe80;
  undefined2 in_stack_fffffffffffffe82;
  int in_stack_fffffffffffffe84;
  undefined1 *in_stack_fffffffffffffe88;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  value_type in_stack_fffffffffffffe9c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  longdouble in_stack_fffffffffffffec0;
  undefined4 local_134;
  undefined6 in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed6;
  vector<long_double,_std::allocator<long_double>_> *in_stack_fffffffffffffed8;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff10;
  ulong st;
  size_t *ix_arr_00;
  undefined8 in_stack_ffffffffffffff48;
  value_type vVar8;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar9;
  undefined6 in_stack_ffffffffffffff58;
  undefined6 uVar10;
  undefined2 in_stack_ffffffffffffff5e;
  ulong local_90;
  undefined8 local_60;
  undefined1 local_51 [33];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_30;
  long local_28;
  long local_20;
  
  in_RDI[0x90] = (bool)(*(byte *)(in_RDX + 0x90) & 1);
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  if ((in_RDI[0x90] & 1U) != 0) {
    std::vector<long_double,_std::allocator<long_double>_>::reserve
              ((vector<long_double,_std::allocator<long_double>_> *)in_stack_fffffffffffffea0,
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_51._9_10_ = (unkbyte10)0;
    std::vector<long_double,_std::allocator<long_double>_>::push_back
              ((vector<long_double,_std::allocator<long_double>_> *)
               CONCAT44(in_stack_fffffffffffffe74,
                        CONCAT22(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70)),
               in_stack_fffffffffffffe68);
  }
  if ((*(long *)(local_20 + 0xc0) == 0) && (*(long *)(local_20 + 0xd0) == 0)) {
    if (*(long *)(local_20 + 8) != 0) {
      std::vector<double,_std::allocator<double>_>::reserve
                (in_stack_fffffffffffffea0,
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      if ((in_RDI[0x90] & 1U) == 0) {
        std::vector<long_double,_std::allocator<long_double>_>::resize
                  ((vector<long_double,_std::allocator<long_double>_> *)in_stack_fffffffffffffe90,
                   (size_type)in_stack_fffffffffffffe88);
      }
    }
    if (*(long *)(local_20 + 0x28) != 0) {
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    local_51[0] = 0;
    local_60 = 0;
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)0x363493);
    if (*(long *)(local_20 + 0x28) != 0) {
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffffe90,
                 (size_type)in_stack_fffffffffffffe88);
    }
    ColumnSampler<long_double>::prepare_full_pass
              ((ColumnSampler<long_double> *)
               CONCAT44(in_stack_fffffffffffffe84,
                        CONCAT22(in_stack_fffffffffffffe82,in_stack_fffffffffffffe80)));
    while (bVar1 = ColumnSampler<long_double>::sample_col
                             (in_stack_fffffffffffffe78,
                              (size_t *)
                              CONCAT44(in_stack_fffffffffffffe74,
                                       CONCAT22(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70)
                                      )), bVar1) {
      if (local_90 < *(ulong *)(local_20 + 8)) {
        if (*(long *)(local_20 + 0x68) == 0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x363668);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_30);
          in_stack_ffffffffffffff0c = *(undefined4 *)(local_28 + 0x88);
          in_stack_ffffffffffffff10 =
               (vector<int,_std::allocator<int>_> *)
               std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),local_90);
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),local_90);
          in_stack_fffffffffffffe70 = SUB82(local_51,0);
          in_stack_fffffffffffffe72 = (undefined2)((ulong)local_51 >> 0x10);
          in_stack_fffffffffffffe74 = (undefined4)((ulong)local_51 >> 0x20);
          get_range<double>(SUB108(in_stack_fffffffffffffec0,0),
                            (double *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                            (size_t)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                            (MissingAction)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                            (double *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                            (double *)CONCAT26(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0),
                            (bool *)in_stack_fffffffffffffed8);
        }
        else {
          col_num = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x36354e);
          sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_30);
          end = sVar4 - 1;
          ix_arr_00 = *(size_t **)(local_20 + 0x58);
          pvVar2 = *(reference *)(local_20 + 0x68);
          uVar9 = *(undefined4 *)(local_28 + 0x88);
          st = local_90;
          in_stack_fffffffffffffe78 =
               (ColumnSampler<long_double> *)
               std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),local_90);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),local_90);
          in_stack_fffffffffffffe88 = local_51;
          in_stack_fffffffffffffe70 = (undefined2)uVar9;
          in_stack_fffffffffffffe72 = (undefined2)((uint)uVar9 >> 0x10);
          in_stack_fffffffffffffe80 = SUB82(pvVar5,0);
          in_stack_fffffffffffffe82 = (undefined2)((ulong)pvVar5 >> 0x10);
          in_stack_fffffffffffffe84 = (int)((ulong)pvVar5 >> 0x20);
          get_range<double,long>
                    (ix_arr_00,st,end,(size_t)col_num,(double *)in_stack_ffffffffffffff10,
                     (long *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (long *)in_stack_fffffffffffffe78,(MissingAction)in_stack_ffffffffffffff48,
                     (double *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (double *)CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58),in_RDI)
          ;
        }
        if ((local_51[0] & 1) != 0) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),local_90);
          *pvVar5 = 0.0;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),local_90);
          *pvVar5 = 0.0;
          if ((in_RDI[0x90] & 1U) == 0) {
            pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                               ((vector<long_double,_std::allocator<long_double>_> *)(in_RDI + 0x98)
                                ,local_90);
            *(longdouble *)pvVar3 = (longdouble)0;
          }
          ColumnSampler<long_double>::drop_col
                    ((ColumnSampler<long_double> *)
                     CONCAT44(in_stack_fffffffffffffe74,
                              CONCAT22(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70)),
                     (size_t)pvVar2);
        }
        if ((in_RDI[0x90] & 1U) == 0) {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),local_90);
          in_stack_fffffffffffffec0 = (longdouble)*pvVar2;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),local_90);
          local_134 = SUB104(in_stack_fffffffffffffec0 - (longdouble)*pvVar2,0);
          in_stack_fffffffffffffed0 =
               (undefined6)((unkuint10)(in_stack_fffffffffffffec0 - (longdouble)*pvVar2) >> 0x20);
          in_stack_fffffffffffffed8 =
               (vector<long_double,_std::allocator<long_double>_> *)(in_RDI + 0x98);
          pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                             (in_stack_fffffffffffffed8,local_90);
          *(unkuint10 *)pvVar3 = CONCAT64(in_stack_fffffffffffffed0,local_134);
          pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                             (in_stack_fffffffffffffed8,local_90);
          in_stack_fffffffffffffe78 = SUB108((longdouble)0,0);
          in_stack_fffffffffffffe80 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
          in_stack_fffffffffffffe70 = (undefined2)((unkuint10)*(unkbyte10 *)pvVar3 >> 0x40);
          Var7 = in_ST5;
          std::fmax(__x,in_XMM1_Qa);
          pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                             (in_stack_fffffffffffffed8,local_90);
          *(unkbyte10 *)pvVar3 = in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = Var7;
        }
      }
      else {
        in_stack_fffffffffffffea0 =
             (vector<double,_std::allocator<double>_> *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3638b8);
        in_stack_fffffffffffffea8 =
             *(long *)(local_20 + 0x10) +
             *(long *)(local_20 + 0x30) * (local_90 - *(long *)(local_20 + 8)) * 4;
        sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_30);
        in_stack_fffffffffffffeb0 = (char *)(sVar4 - 1);
        in_stack_fffffffffffffeb8 = *(undefined4 *)(*(long *)(local_20 + 0x18) + local_90 * 4);
        in_stack_fffffffffffffebc = *(undefined4 *)(local_28 + 0x88);
        col_00 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                           ((vector<signed_char,_std::allocator<signed_char>_> *)0x363949);
        in_stack_fffffffffffffe78 = (ColumnSampler<long_double> *)local_51;
        in_stack_fffffffffffffe70 = SUB82(&local_60,0);
        in_stack_fffffffffffffe72 = (undefined2)((ulong)&local_60 >> 0x10);
        in_stack_fffffffffffffe74 = (undefined4)((ulong)&local_60 >> 0x20);
        get_categs((size_t *)in_stack_fffffffffffffea0,
                   (int *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   (size_t)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe84,
                   CONCAT22(in_stack_fffffffffffffe82,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffeb0,
                   (size_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   SUB108(in_stack_fffffffffffffec0,0));
        if ((local_51[0] & 1) == 0) {
          in_stack_fffffffffffffe9c = (value_type)local_60;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb0),
                              local_90 - *(long *)(local_20 + 8));
          *pvVar6 = in_stack_fffffffffffffe9c;
        }
        else {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb0),
                              local_90 - *(long *)(local_20 + 8));
          *pvVar6 = 1;
          ColumnSampler<long_double>::drop_col
                    ((ColumnSampler<long_double> *)
                     CONCAT44(in_stack_fffffffffffffe74,
                              CONCAT22(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70)),
                     (size_t)col_00);
        }
      }
    }
    if ((in_RDI[0x90] & 1U) == 0) {
      std::vector<int,_std::allocator<int>_>::operator=
                (in_stack_ffffffffffffff10,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    std::vector<signed_char,_std::allocator<signed_char>_>::~vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)
               CONCAT44(in_stack_fffffffffffffe84,
                        CONCAT22(in_stack_fffffffffffffe82,in_stack_fffffffffffffe80)));
  }
  else {
    if (*(long *)(local_20 + 8) != 0) {
      std::vector<double,_std::allocator<double>_>::reserve
                (in_stack_fffffffffffffea0,
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      std::vector<double,std::allocator<double>>::assign<double*,void>
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,
                          CONCAT22(in_stack_fffffffffffffe82,in_stack_fffffffffffffe80)),
                 (double *)in_stack_fffffffffffffe78,
                 (double *)
                 CONCAT44(in_stack_fffffffffffffe74,
                          CONCAT22(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70)));
      std::vector<double,std::allocator<double>>::assign<double*,void>
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,
                          CONCAT22(in_stack_fffffffffffffe82,in_stack_fffffffffffffe80)),
                 (double *)in_stack_fffffffffffffe78,
                 (double *)
                 CONCAT44(in_stack_fffffffffffffe74,
                          CONCAT22(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70)));
    }
    if (*(long *)(local_20 + 0x28) != 0) {
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      std::vector<int,std::allocator<int>>::assign<int*,void>
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,
                          CONCAT22(in_stack_fffffffffffffe82,in_stack_fffffffffffffe80)),
                 (int *)in_stack_fffffffffffffe78,
                 (int *)CONCAT44(in_stack_fffffffffffffe74,
                                 CONCAT22(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70)));
    }
    if ((in_RDI[0x90] & 1U) == 0) {
      if (*(long *)(local_20 + 8) != 0) {
        std::vector<long_double,_std::allocator<long_double>_>::resize
                  ((vector<long_double,_std::allocator<long_double>_> *)in_stack_fffffffffffffe90,
                   (size_type)in_stack_fffffffffffffe88);
        for (local_51._1_8_ = 0; (ulong)local_51._1_8_ < *(ulong *)(local_20 + 8);
            local_51._1_8_ = local_51._1_8_ + 1) {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                              local_51._1_8_);
          vVar8 = *pvVar2;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),
                              local_51._1_8_);
          uVar9 = SUB104((longdouble)(vVar8 - *pvVar2),0);
          uVar10 = (undefined6)((unkuint10)(longdouble)(vVar8 - *pvVar2) >> 0x20);
          pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                             ((vector<long_double,_std::allocator<long_double>_> *)(in_RDI + 0x98),
                              local_51._1_8_);
          *(unkuint10 *)pvVar3 = CONCAT64(uVar10,uVar9);
        }
      }
      if (*(long *)(local_20 + 0x28) != 0) {
        std::vector<int,_std::allocator<int>_>::operator=
                  (in_stack_ffffffffffffff10,
                   (vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      }
    }
  }
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::initialize_bdens(const InputData &input_data,
                                         const ModelParams &model_params,
                                         std::vector<size_t> &ix_arr,
                                         ColumnSampler<ldouble_safe> &col_sampler)
{
    this->fast_bratio = model_params.fast_bratio;
    if (this->fast_bratio)
    {
        this->multipliers.reserve(model_params.max_depth + 3);
        this->multipliers.push_back(0);
    }

    if (input_data.range_low != NULL || input_data.ncat_ != NULL)
    {
        if (input_data.ncols_numeric)
        {
            this->queue_box.reserve(model_params.max_depth+3);
            this->box_low.assign(input_data.range_low, input_data.range_low + input_data.ncols_numeric);
            this->box_high.assign(input_data.range_high, input_data.range_high + input_data.ncols_numeric);
        }

        if (input_data.ncols_categ)
        {
            this->queue_ncat.reserve(model_params.max_depth+2);
            this->ncat.assign(input_data.ncat_, input_data.ncat_ + input_data.ncols_categ);
        }

        if (!this->fast_bratio)
        {
            if (input_data.ncols_numeric)
            {
                this->ranges.resize(input_data.ncols_numeric);
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                    this->ranges[col] = this->box_high[col] - this->box_low[col];
            }

            if (input_data.ncols_categ)
            {
                this->ncat_orig = this->ncat;
            }
        }

        return;
    }

    if (input_data.ncols_numeric)
    {
        this->queue_box.reserve(model_params.max_depth+3);
        this->box_low.resize(input_data.ncols_numeric);
        this->box_high.resize(input_data.ncols_numeric);
        if (!this->fast_bratio)
            this->ranges.resize(input_data.ncols_numeric);
    }
    if (input_data.ncols_categ)
    {
        this->queue_ncat.reserve(model_params.max_depth+2);
    }
    bool unsplittable = false;
    
    size_t npresent = 0;
    std::vector<signed char> categ_present;
    if (input_data.ncols_categ)
    {
        categ_present.resize(input_data.max_categ);
    }


    col_sampler.prepare_full_pass();
    size_t col;
    while (col_sampler.sample_col(col))
    {
        if (col < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr != NULL)
            {
                get_range((size_t*)ix_arr.data(), (size_t)0, ix_arr.size()-(size_t)1, col,
                          input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }

            else
            {
                get_range((size_t*)ix_arr.data(), input_data.numeric_data + input_data.nrows * col, (size_t)0, ix_arr.size()-(size_t)1,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }


            if (unsplittable)
            {
                this->box_low[col] = 0;
                this->box_high[col] = 0;
                if (!this->fast_bratio)
                    this->ranges[col] = 0;
                col_sampler.drop_col(col);
            }

            if (!this->fast_bratio)
            {
                this->ranges[col] = (ldouble_safe)this->box_high[col] - (ldouble_safe)this->box_low[col];
                this->ranges[col] = std::fmax(this->ranges[col], (ldouble_safe)0);
            }
        }

        else
        {
            get_categs((size_t*)ix_arr.data(),
                       input_data.categ_data + input_data.nrows * (col - input_data.ncols_numeric),
                       (size_t)0, ix_arr.size()-(size_t)1, input_data.ncat[col],
                       model_params.missing_action, categ_present.data(), npresent, unsplittable);

            if (unsplittable)
            {
                this->ncat[col - input_data.ncols_numeric] = 1;
                col_sampler.drop_col(col);
            }

            else
            {
                this->ncat[col - input_data.ncols_numeric] = npresent;
            }
        }
    }

    if (!this->fast_bratio)
        this->ncat_orig = this->ncat;
}